

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::Char1(AsciiParser *this,char *c)

{
  ulong uVar1;
  StreamReader *pSVar2;
  ulong uVar3;
  
  pSVar2 = this->_sr;
  uVar3 = pSVar2->length_;
  uVar1 = pSVar2->idx_ + 1;
  if (uVar1 <= uVar3) {
    *c = pSVar2->binary_[pSVar2->idx_];
    pSVar2->idx_ = pSVar2->idx_ + 1;
  }
  return uVar1 <= uVar3;
}

Assistant:

bool AsciiParser::Char1(char *c) { return _sr->read1(c); }